

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall crnlib::dynamic_string::set(dynamic_string *this,char *p,uint max_len)

{
  bool bVar1;
  uint len_00;
  size_t sVar2;
  uint len;
  uint max_len_local;
  char *p_local;
  dynamic_string *this_local;
  
  sVar2 = strlen(p);
  len_00 = math::minimum<unsigned_int>(max_len,(uint)sVar2);
  if ((len_00 == 0) || (0xfffe < len_00)) {
    clear(this);
  }
  else if (((this->m_pStr == (char *)0x0) || (p < this->m_pStr)) ||
          (this->m_pStr + (int)(uint)this->m_buf_size <= p)) {
    bVar1 = ensure_buf(this,len_00,false);
    if (bVar1) {
      this->m_len = (uint16)len_00;
      memcpy(this->m_pStr,p,(long)(int)(this->m_len + 1));
    }
  }
  else {
    if (this->m_pStr != p) {
      memmove(this->m_pStr,p,(ulong)len_00);
    }
    this->m_pStr[len_00] = '\0';
    this->m_len = (uint16)len_00;
  }
  check(this);
  return this;
}

Assistant:

dynamic_string& dynamic_string::set(const char* p, uint max_len)
    {
        CRNLIB_ASSERT(p);

        const uint len = math::minimum<uint>(max_len, static_cast<uint>(strlen(p)));
        CRNLIB_ASSERT(len < cUINT16_MAX);

        if ((!len) || (len >= cUINT16_MAX))
        {
            clear();
        }
        else if ((m_pStr) && (p >= m_pStr) && (p < (m_pStr + m_buf_size)))
        {
            if (m_pStr != p)
            {
                memmove(m_pStr, p, len);
            }
            m_pStr[len] = '\0';
            m_len = static_cast<uint16>(len);
        }
        else if (ensure_buf(len, false))
        {
            m_len = static_cast<uint16>(len);
            memcpy(m_pStr, p, m_len + 1);
        }

        check();

        return *this;
    }